

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmReturn(LlvmCompilationContext *ctx,ExprReturn *node)

{
  LLVMBuilderRef pLVar1;
  bool bVar2;
  LLVMValueRef pLVar3;
  TypeBase *pTVar4;
  LLVMValueRef pLVar5;
  LLVMBasicBlockRef pLVar6;
  LLVMBasicBlockRef afterReturn;
  LLVMValueRef arguments_2 [1];
  LLVMValueRef arguments_1 [1];
  LLVMValueRef arguments [1];
  LLVMValueRef value;
  ExprReturn *node_local;
  LlvmCompilationContext *ctx_local;
  
  pLVar3 = CompileLlvm(ctx,node->value);
  if (node->coroutineStateUpdate != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->coroutineStateUpdate);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  if (node->value->type == ctx->ctx->typeVoid) {
    if (((ctx->currentFunctionGlobal ^ 0xffU) & 1) == 0) {
      __assert_fail("!ctx.currentFunctionGlobal",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x5b1,"LLVMValueRef CompileLlvmReturn(LlvmCompilationContext &, ExprReturn *)")
      ;
    }
    LLVMBuildRetVoid(ctx->builder);
  }
  else if ((ctx->currentFunctionGlobal & 1U) == 0) {
    pTVar4 = GetStackType(ctx,node->value->type);
    pLVar3 = ConvertToDataType(ctx,pLVar3,pTVar4,node->value->type);
    bVar2 = IsStructReturnType(ctx->currentFunctionSource->type->returnType);
    if (bVar2) {
      pLVar1 = ctx->builder;
      pLVar5 = LLVMGetParam(ctx->currentFunction,0);
      LLVMBuildStore(pLVar1,pLVar3,pLVar5);
      LLVMBuildRetVoid(ctx->builder);
    }
    else {
      LLVMBuildRet(ctx->builder,pLVar3);
    }
  }
  else {
    pTVar4 = GetStackType(ctx,node->value->type);
    if ((pTVar4 == ctx->ctx->typeInt) || (bVar2 = isType<TypeEnum>(node->value->type), bVar2)) {
      pLVar1 = ctx->builder;
      arguments_1[0] = pLVar3;
      pLVar3 = LLVMGetNamedFunction(ctx->module,"__llvmReturnInt");
      LLVMBuildCall(pLVar1,pLVar3,arguments_1,1,"");
      LLVMBuildRetVoid(ctx->builder);
    }
    else {
      pTVar4 = GetStackType(ctx,node->value->type);
      if (pTVar4 == ctx->ctx->typeLong) {
        pLVar1 = ctx->builder;
        arguments_2[0] = pLVar3;
        pLVar3 = LLVMGetNamedFunction(ctx->module,"__llvmReturnLong");
        LLVMBuildCall(pLVar1,pLVar3,arguments_2,1,"");
        LLVMBuildRetVoid(ctx->builder);
      }
      else {
        pTVar4 = GetStackType(ctx,node->value->type);
        if (pTVar4 != ctx->ctx->typeDouble) {
          __assert_fail("!\"unknown global return type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                        ,0x5d3,
                        "LLVMValueRef CompileLlvmReturn(LlvmCompilationContext &, ExprReturn *)");
        }
        pLVar1 = ctx->builder;
        afterReturn = (LLVMBasicBlockRef)pLVar3;
        pLVar3 = LLVMGetNamedFunction(ctx->module,"__llvmReturnDouble");
        LLVMBuildCall(pLVar1,pLVar3,(LLVMValueRef *)&afterReturn,1,"");
        LLVMBuildRetVoid(ctx->builder);
      }
    }
  }
  pLVar6 = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"after_return");
  LLVMPositionBuilderAtEnd(ctx->builder,pLVar6);
  pLVar3 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return pLVar3;
}

Assistant:

LLVMValueRef CompileLlvmReturn(LlvmCompilationContext &ctx, ExprReturn *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);

	if(node->coroutineStateUpdate)
		CompileLlvm(ctx, node->coroutineStateUpdate);

	if(node->closures)
		CompileLlvm(ctx, node->closures);

	if(node->value->type == ctx.ctx.typeVoid)
	{
		assert(!ctx.currentFunctionGlobal);

		LLVMBuildRetVoid(ctx.builder);
	}
	else
	{
		if(ctx.currentFunctionGlobal)
		{
			if(GetStackType(ctx, node->value->type) == ctx.ctx.typeInt || isType<TypeEnum>(node->value->type))
			{
				LLVMValueRef arguments[] = { value };

				LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmReturnInt"), arguments, 1, "");

				LLVMBuildRetVoid(ctx.builder);
			}
			else if(GetStackType(ctx, node->value->type) == ctx.ctx.typeLong)
			{
				LLVMValueRef arguments[] = { value };

				LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmReturnLong"), arguments, 1, "");

				LLVMBuildRetVoid(ctx.builder);
			}
			else if(GetStackType(ctx, node->value->type) == ctx.ctx.typeDouble)
			{
				LLVMValueRef arguments[] = { value };

				LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmReturnDouble"), arguments, 1, "");

				LLVMBuildRetVoid(ctx.builder);
			}
			else
			{
				assert(!"unknown global return type");
			}
		}
		else
		{
			value = ConvertToDataType(ctx, value, GetStackType(ctx, node->value->type), node->value->type);

			if(IsStructReturnType(ctx.currentFunctionSource->type->returnType))
			{
				LLVMBuildStore(ctx.builder, value, LLVMGetParam(ctx.currentFunction, 0));

				LLVMBuildRetVoid(ctx.builder);
			}
			else
			{
				LLVMBuildRet(ctx.builder, value);
			}
		}
	}

	LLVMBasicBlockRef afterReturn = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "after_return");

	LLVMPositionBuilderAtEnd(ctx.builder, afterReturn);

	return CheckType(ctx, node, NULL);
}